

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

curl_off_t trspeed(curl_off_t size,curl_off_t us)

{
  if (us < 1) {
    return size * 1000000;
  }
  if (size < 0x8637bd05af6) {
    return (size * 1000000) / us;
  }
  if (999999 < (ulong)us) {
    return (ulong)size / ((ulong)us / 1000000);
  }
  return 0x7fffffffffffffff;
}

Assistant:

static curl_off_t trspeed(curl_off_t size, /* number of bytes */
                          curl_off_t us)   /* microseconds */
{
  if(us < 1)
    return size * 1000000;
  else if(size < CURL_OFF_T_MAX/1000000)
    return (size * 1000000) / us;
  else if(us >= 1000000)
    return size / (us / 1000000);
  else
    return CURL_OFF_T_MAX;
}